

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Colset * sqlite3Fts5ParseColsetInvert(Fts5Parse *pParse,Fts5Colset *p)

{
  int iVar1;
  Fts5Colset *pFVar2;
  int *in_RSI;
  long *in_RDI;
  int iOld;
  int i;
  int nCol;
  Fts5Colset *pRet;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  int iVar5;
  
  iVar5 = *(int *)(*in_RDI + 0x20);
  pFVar2 = (Fts5Colset *)
           sqlite3Fts5MallocZero
                     ((int *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),
                      CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (pFVar2 != (Fts5Colset *)0x0) {
    iVar3 = 0;
    for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
      if ((iVar3 < *in_RSI) && (in_RSI[(long)iVar3 + 1] == iVar4)) {
        iVar3 = iVar3 + 1;
      }
      else {
        iVar1 = pFVar2->nCol;
        pFVar2->nCol = iVar1 + 1;
        pFVar2->aiCol[iVar1] = iVar4;
      }
    }
  }
  sqlite3_free((void *)0x26df8d);
  return pFVar2;
}

Assistant:

static Fts5Colset *sqlite3Fts5ParseColsetInvert(Fts5Parse *pParse, Fts5Colset *p){
  Fts5Colset *pRet;
  int nCol = pParse->pConfig->nCol;

  pRet = (Fts5Colset*)sqlite3Fts5MallocZero(&pParse->rc,
      sizeof(Fts5Colset) + sizeof(int)*nCol
  );
  if( pRet ){
    int i;
    int iOld = 0;
    for(i=0; i<nCol; i++){
      if( iOld>=p->nCol || p->aiCol[iOld]!=i ){
        pRet->aiCol[pRet->nCol++] = i;
      }else{
        iOld++;
      }
    }
  }

  sqlite3_free(p);
  return pRet;
}